

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsbndmat.cpp
# Opt level: O1

int __thiscall
TPZSBMatrix<std::complex<float>_>::Subst_Diag
          (TPZSBMatrix<std::complex<float>_> *this,TPZFMatrix<std::complex<float>_> *B)

{
  int iVar1;
  undefined4 extraout_var;
  int extraout_var_00;
  undefined4 extraout_var_01;
  long lVar2;
  long lVar3;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined8 local_40;
  undefined4 local_38;
  undefined4 uStack_34;
  
  lVar3 = (B->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
  iVar1 = (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])();
  if ((lVar3 != CONCAT44(extraout_var,iVar1)) ||
     ((this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fDecomposed == '\0')) {
    TPZMatrix<std::complex<float>_>::Error
              ("virtual int TPZSBMatrix<std::complex<float>>::Subst_Diag(TPZFMatrix<TVar> *) const [TVar = std::complex<float>]"
               ,"Subst_Diag-> uncompatible matrices");
  }
  iVar1 = (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])(this);
  if (CONCAT44(extraout_var_00,iVar1) != 0 && -1 < extraout_var_00) {
    lVar3 = 0;
    do {
      if (0 < (B->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol) {
        lVar2 = 0;
        do {
          (*(B->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x24])(B,lVar3,lVar2);
          local_38 = extraout_XMM0_Da;
          uStack_34 = extraout_XMM0_Db;
          (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x24])(this,lVar3,lVar3);
          local_40 = __divsc3(local_38,uStack_34,extraout_XMM0_Da_00,extraout_XMM0_Db_00);
          (*(B->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x23])(B,lVar3,lVar2,&local_40);
          lVar2 = lVar2 + 1;
        } while (lVar2 < (B->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol);
      }
      lVar3 = lVar3 + 1;
      iVar1 = (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
                _vptr_TPZSavable[0xc])(this);
    } while (lVar3 < CONCAT44(extraout_var_01,iVar1));
  }
  return 1;
}

Assistant:

int TPZSBMatrix<TVar>::Subst_Diag( TPZFMatrix<TVar> *B ) const
{
    
    if ( (B->Rows() != this->Dim()) || !this->fDecomposed )
       this->Error(__PRETTY_FUNCTION__,"Subst_Diag-> uncompatible matrices") ;
    
    
    int64_t size = fBand + 1;
    for ( int64_t k = 0; k < this->Dim(); k++ )
        for ( int64_t j = 0; j < B->Cols(); j++ )
            B->PutVal( k, j, B->GetVal( k, j) / GetVal(k,k) );
    
    return( 1 );
}